

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

void __thiscall
pbrt::CameraSceneEntity::CameraSceneEntity
          (CameraSceneEntity *this,string *name,ParameterDictionary *parameters,FileLoc loc,
          CameraTransform *cameraTransform,string *medium)

{
  pointer pcVar1;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_a0;
  ParameterDictionary local_98;
  
  local_a0.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_98.params,&parameters->params,&local_a0);
  local_98.colorSpace = parameters->colorSpace;
  SceneEntity::SceneEntity(&this->super_SceneEntity,name,&local_98,loc);
  local_98.params.nStored = 0;
  (*(local_98.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_98.params.alloc.memoryResource,local_98.params.ptr,local_98.params.nAlloc << 3,8)
  ;
  memcpy(&this->cameraTransform,cameraTransform,0x338);
  (this->medium)._M_dataplus._M_p = (pointer)&(this->medium).field_2;
  pcVar1 = (medium->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->medium,pcVar1,pcVar1 + medium->_M_string_length);
  return;
}

Assistant:

CameraSceneEntity(const std::string &name, ParameterDictionary parameters,
                      FileLoc loc, const CameraTransform &cameraTransform,
                      const std::string &medium)
        : SceneEntity(name, parameters, loc),
          cameraTransform(cameraTransform),
          medium(medium) {}